

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewClasses::verifyResultData
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          ,uchar *texture_data_ptr,uchar *view_data_ptr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _format format;
  deUint32 dVar5;
  RenderContext *pRVar6;
  long lVar7;
  uchar *puVar8;
  TestError *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  ostream *poVar12;
  void *pvVar13;
  float fVar14;
  undefined4 local_e50;
  undefined4 local_e48;
  undefined4 local_e44;
  MessageBuilder local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  MessageBuilder local_c68;
  uint local_ae4;
  long lStack_ae0;
  uint n;
  stringstream sampled_view_data_sstream;
  ostream local_ad0;
  long local_958;
  stringstream mipmap_data_sstream;
  ostream local_948;
  MessageBuilder local_7d0;
  uint local_650;
  uint local_64c;
  MessageBuilder local_648;
  uint local_4c8;
  uint local_4c4;
  MessageBuilder local_4c0;
  uint local_340;
  uint local_33c;
  MessageBuilder local_338;
  float local_1b8;
  float local_1b4;
  uint smaller_value_1;
  uint larger_value_1;
  int smaller_value;
  int larger_value;
  uint epsilon_uint;
  int epsilon_int;
  float epsilon_float;
  uint n_component_3;
  void *result_data;
  long local_188;
  unsigned_short *reference_data_4;
  uint mask_a_1;
  uint mask_rgb_1;
  uint *reference_data_3;
  uint mask_a;
  uint mask_rgb;
  uint *reference_data_2;
  uint local_158;
  float shared_exponent;
  uint blue_component_1;
  uint green_component_1;
  uint red_component_1;
  uint exponent;
  uint *reference_data_1;
  Float<unsigned_int,_5,_6,_15,_0U> local_138;
  uint local_134;
  uint local_130;
  uint blue_component;
  uint green_component;
  uint red_component;
  uint *reference_data;
  uint local_10c;
  float *pfStack_108;
  uint n_component_2;
  uchar *view_texel_data;
  float local_f8;
  _sampler_type view_sampler_type;
  uint view_components_uint [4];
  int view_components_int [4];
  float view_components_float [4];
  uint reference_components_uint [4];
  int reference_components_int [4];
  float reference_components_float [4];
  uchar *mipmap_texel_data;
  GLuint local_88;
  uint n_texel;
  GLuint reference_tex_id;
  uint n_component_1;
  uint n_component;
  _format view_format;
  uint view_component_sizes [4];
  _format texture_format;
  uint n_view_components;
  uint n_bits_per_view_texel;
  bool is_view_internalformat_compressed;
  Functions *gl;
  uchar *puStack_48;
  bool can_continue;
  uchar *mipmap_data;
  char *pcStack_38;
  bool has_failed;
  char *view_internalformat_string;
  char *texture_internalformat_string;
  uchar *view_data_ptr_local;
  uchar *texture_data_ptr_local;
  GLenum view_internalformat_local;
  GLenum texture_internalformat_local;
  TextureViewTestViewClasses *this_local;
  undefined4 extraout_var;
  
  texture_internalformat_string = (char *)view_data_ptr;
  view_data_ptr_local = texture_data_ptr;
  texture_data_ptr_local._0_4_ = view_internalformat;
  texture_data_ptr_local._4_4_ = texture_internalformat;
  _view_internalformat_local = this;
  view_internalformat_string = TextureViewUtilities::getInternalformatString(texture_internalformat)
  ;
  pcStack_38 = TextureViewUtilities::getInternalformatString((GLenum)texture_data_ptr_local);
  bVar2 = false;
  puStack_48 = (uchar *)0x0;
  iVar4 = memcmp(view_data_ptr_local,texture_internalformat_string,(ulong)this->m_view_data_offset);
  if (iVar4 != 0) {
    bVar1 = true;
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar4 = (*pRVar6->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar4);
    bVar3 = TextureViewUtilities::isInternalformatCompressed((GLenum)texture_data_ptr_local);
    view_component_sizes[3] =
         TextureViewUtilities::getAmountOfComponentsForInternalformat
                   ((GLenum)texture_data_ptr_local);
    view_component_sizes[2] =
         TextureViewUtilities::getFormatOfInternalformat(texture_data_ptr_local._4_4_);
    memset(&n_component,0,0x10);
    format = TextureViewUtilities::getFormatOfInternalformat((GLenum)texture_data_ptr_local);
    if (bVar3) {
      if ((texture_data_ptr_local._4_4_ == 0x8e8e) || (texture_data_ptr_local._4_4_ == 0x8e8f)) {
        for (reference_tex_id = 0; reference_tex_id < view_component_sizes[3];
            reference_tex_id = reference_tex_id + 1) {
          (&n_component)[reference_tex_id] = 0x20;
        }
        texture_format = view_component_sizes[3] << 5;
      }
      else {
        for (n_texel = 0; n_texel < view_component_sizes[3]; n_texel = n_texel + 1) {
          (&n_component)[n_texel] = 8;
        }
        texture_format = view_component_sizes[3] << 3;
      }
    }
    else {
      TextureViewUtilities::getComponentSizeForInternalformat
                ((GLenum)texture_data_ptr_local,&n_component);
      texture_format = n_component + view_format + view_component_sizes[0] + view_component_sizes[1]
      ;
    }
    puStack_48 = this->m_mipmap_data;
    if (bVar3) {
      if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
        if (this->m_decompressed_mipmap_data != (uchar *)0x0) {
          operator_delete__(this->m_decompressed_mipmap_data);
        }
        this->m_decompressed_mipmap_data = (uchar *)0x0;
      }
      puVar8 = (uchar *)operator_new__((ulong)(this->m_texture_width * this->m_texture_height *
                                              (texture_format >> 3)));
      this->m_decompressed_mipmap_data = puVar8;
      local_88 = this->m_to_id;
      if ((texture_data_ptr_local._4_4_ == 0x8e8e) || (texture_data_ptr_local._4_4_ == 0x8e8f)) {
        local_88 = this->m_view_to_id;
      }
      (**(code **)(lVar7 + 0xb8))(0xde1,local_88);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d93);
      if (view_component_sizes[3] == 4) {
        local_e44 = 0x1908;
      }
      else {
        if (view_component_sizes[3] == 3) {
          local_e48 = 0x1907;
        }
        else {
          local_e48 = 0x1903;
          if (view_component_sizes[3] == 2) {
            local_e48 = 0x8227;
          }
        }
        local_e44 = local_e48;
      }
      if (view_component_sizes[2] == 3) {
        local_e50 = 0x1400;
      }
      else {
        local_e50 = 0x1401;
        if (view_component_sizes[2] == 0) {
          local_e50 = 0x1406;
        }
      }
      (**(code **)(lVar7 + 0xaa0))(0xde1,0,local_e44,local_e50,this->m_decompressed_mipmap_data);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glGetTexImage() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d9e);
      puStack_48 = this->m_decompressed_mipmap_data;
    }
    mipmap_texel_data._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (mipmap_texel_data._4_4_ < this->m_texture_height * this->m_texture_width) {
        bVar3 = bVar1;
      }
      if (!bVar3) break;
      reference_components_float._8_8_ =
           puStack_48 + (texture_format >> 3) * mipmap_texel_data._4_4_;
      memset(reference_components_int + 2,0,0x10);
      memset(reference_components_uint + 2,0,0x10);
      memset(view_components_float + 2,0,0x10);
      memset(view_components_int + 2,0,0x10);
      memset(view_components_uint + 2,0,0x10);
      memset(&local_f8,0,0x10);
      view_texel_data._4_4_ =
           TextureViewUtilities::getSamplerTypeForInternalformat((GLenum)texture_data_ptr_local);
      pfStack_108 = (float *)(texture_internalformat_string +
                             (ulong)view_component_sizes[3] * 4 * (ulong)mipmap_texel_data._4_4_);
      for (local_10c = 0; local_10c < view_component_sizes[3]; local_10c = local_10c + 1) {
        if (view_texel_data._4_4_ == SAMPLER_TYPE_FLOAT) {
          view_components_int[(ulong)local_10c + 2] = (int)*pfStack_108;
        }
        else if (view_texel_data._4_4_ == SAMPLER_TYPE_SIGNED_INTEGER) {
          view_components_uint[(ulong)local_10c + 2] = (uint)*pfStack_108;
        }
        else {
          if (view_texel_data._4_4_ != SAMPLER_TYPE_UNSIGNED_INTEGER) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"Unrecognized sampler type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1dd7);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (&local_f8)[local_10c] = *pfStack_108;
        }
        pfStack_108 = pfStack_108 + 1;
      }
      if ((GLenum)texture_data_ptr_local == 0x8c3a) {
        green_component = (uint)reference_components_float[2];
        red_component = (uint)reference_components_float[3];
        blue_component = *(uint *)reference_components_float._8_8_ & 0x7ff;
        local_130 = *(uint *)reference_components_float._8_8_ >> 0xb & 0x7ff;
        local_134 = *(uint *)reference_components_float._8_8_ >> 0x16;
        if (view_texel_data._4_4_ != SAMPLER_TYPE_FLOAT) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1dec);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        tcu::Float<unsigned_int,_5,_6,_15,_0U>::Float(&local_138,blue_component);
        reference_components_int[2] =
             (int)tcu::Float<unsigned_int,_5,_6,_15,_0U>::asFloat(&local_138);
        tcu::Float<unsigned_int,_5,_6,_15,_0U>::Float
                  ((Float<unsigned_int,_5,_6,_15,_0U> *)((long)&reference_data_1 + 4),local_130);
        reference_components_int[3] =
             (int)tcu::Float<unsigned_int,_5,_6,_15,_0U>::asFloat
                            ((Float<unsigned_int,_5,_6,_15,_0U> *)((long)&reference_data_1 + 4));
        tcu::Float<unsigned_int,_5,_5,_15,_0U>::Float
                  ((Float<unsigned_int,_5,_5,_15,_0U> *)&reference_data_1,local_134);
        reference_components_float[0] =
             tcu::Float<unsigned_int,_5,_5,_15,_0U>::asFloat
                       ((Float<unsigned_int,_5,_5,_15,_0U> *)&reference_data_1);
      }
      else if ((GLenum)texture_data_ptr_local == 0x8c3d) {
        red_component_1 = (uint)reference_components_float[2];
        exponent = (uint)reference_components_float[3];
        green_component_1 = *(uint *)reference_components_float._8_8_ >> 0x1b;
        blue_component_1 = *(uint *)reference_components_float._8_8_ & 0x1ff;
        shared_exponent = (float)(*(uint *)reference_components_float._8_8_ >> 9 & 0x1ff);
        local_158 = *(uint *)reference_components_float._8_8_ >> 0x12 & 0x1ff;
        reference_data_2._4_4_ = deFloatPow(2.0,(float)(int)(green_component_1 - 0x18));
        if (view_texel_data._4_4_ != SAMPLER_TYPE_FLOAT) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e03);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        reference_components_int[2] = (int)((float)blue_component_1 * reference_data_2._4_4_);
        reference_components_int[3] = (int)((float)(uint)shared_exponent * reference_data_2._4_4_);
        reference_components_float[0] = (float)local_158 * reference_data_2._4_4_;
      }
      else if ((GLenum)texture_data_ptr_local == 0x8059) {
        mask_a = (uint)reference_components_float[2];
        mask_rgb = (uint)reference_components_float[3];
        reference_data_3._4_4_ = 0x3ff;
        reference_data_3._0_4_ = 3;
        if (view_texel_data._4_4_ != SAMPLER_TYPE_FLOAT) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e15);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        reference_components_int[2] =
             (int)((float)(*(uint *)reference_components_float._8_8_ & 0x3ff) / 1023.0);
        reference_components_int[3] =
             (int)((float)(*(uint *)reference_components_float._8_8_ >> 10 & 0x3ff) / 1023.0);
        reference_components_float[0] =
             (float)(*(uint *)reference_components_float._8_8_ >> 0x14 & 0x3ff) / 1023.0;
        reference_components_float[1] =
             (float)(*(uint *)reference_components_float._8_8_ >> 0x1e) / 3.0;
      }
      else if ((GLenum)texture_data_ptr_local == 0x906f) {
        mask_a_1 = (uint)reference_components_float[2];
        mask_rgb_1 = (uint)reference_components_float[3];
        reference_data_4._4_4_ = 0x3ff;
        reference_data_4._0_4_ = 3;
        if (view_texel_data._4_4_ != SAMPLER_TYPE_UNSIGNED_INTEGER) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e27);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        view_components_float[2] = (float)(*(uint *)reference_components_float._8_8_ & 0x3ff);
        view_components_float[3] = (float)(*(uint *)reference_components_float._8_8_ >> 10 & 0x3ff);
        reference_components_uint[0] = *(uint *)reference_components_float._8_8_ >> 0x14 & 0x3ff;
        reference_components_uint[1] = *(uint *)reference_components_float._8_8_ >> 0x1e;
      }
      else if ((GLenum)texture_data_ptr_local == 0x822f) {
        local_188._0_4_ = reference_components_float[2];
        local_188._4_4_ = reference_components_float[3];
        if (view_texel_data._4_4_ != SAMPLER_TYPE_FLOAT) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Internal error: invalid sampler type requested",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x1e35);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                  ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&result_data + 6),
                   *(StorageType_conflict *)reference_components_float._8_8_);
        reference_components_int[2] =
             (int)tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&result_data + 6));
        tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                  ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&result_data + 4),
                   *(StorageType_conflict *)(local_188 + 2));
        reference_components_int[3] =
             (int)tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&result_data + 4));
      }
      else {
        _epsilon_float = (float *)0x0;
        if (view_texel_data._4_4_ == SAMPLER_TYPE_FLOAT) {
          _epsilon_float = (float *)(reference_components_int + 2);
        }
        else if (view_texel_data._4_4_ == SAMPLER_TYPE_SIGNED_INTEGER) {
          _epsilon_float = (float *)(reference_components_uint + 2);
        }
        else {
          if (view_texel_data._4_4_ != SAMPLER_TYPE_UNSIGNED_INTEGER) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"Unrecognized sampler type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1e49);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          _epsilon_float = view_components_float + 2;
        }
        getComponentDataForByteAlignedInternalformat
                  (this,(uchar *)reference_components_float._8_8_,view_component_sizes[3],
                   &n_component,format,_epsilon_float);
      }
      for (epsilon_int = 0; (uint)epsilon_int < view_component_sizes[3];
          epsilon_int = epsilon_int + 1) {
        bVar3 = TextureViewUtilities::isInternalformatSRGB((GLenum)texture_data_ptr_local);
        if (((bVar3) &&
            (bVar3 = TextureViewUtilities::isInternalformatSRGB(texture_data_ptr_local._4_4_),
            !bVar3)) && (epsilon_int != 3)) {
          if (0.04045 < (float)reference_components_int[(ulong)(uint)epsilon_int + 2]) {
            fVar14 = deFloatPow(((float)reference_components_int[(ulong)(uint)epsilon_int + 2] +
                                0.055) / 1.055,2.4);
            reference_components_int[(ulong)(uint)epsilon_int + 2] = (int)fVar14;
          }
          else {
            reference_components_int[(ulong)(uint)epsilon_int + 2] =
                 (int)((float)reference_components_int[(ulong)(uint)epsilon_int + 2] / 12.92);
          }
        }
        epsilon_uint = (uint)(1.0 / (float)((1 << ((char)(&n_component)[(uint)epsilon_int] - 1U &
                                                  0x1f)) + -1));
        larger_value = 1;
        smaller_value = 1;
        if (view_texel_data._4_4_ == SAMPLER_TYPE_FLOAT) {
          fVar14 = de::abs<float>((float)reference_components_int[(ulong)(uint)epsilon_int + 2] -
                                  (float)view_components_int[(ulong)(uint)epsilon_int + 2]);
          if ((float)epsilon_uint < fVar14) {
            bVar2 = true;
          }
        }
        else if (view_texel_data._4_4_ == SAMPLER_TYPE_SIGNED_INTEGER) {
          if ((int)view_components_uint[(ulong)(uint)epsilon_int + 2] <
              (int)reference_components_uint[(ulong)(uint)epsilon_int + 2]) {
            larger_value_1 = reference_components_uint[(ulong)(uint)epsilon_int + 2];
            smaller_value_1 = view_components_uint[(ulong)(uint)epsilon_int + 2];
          }
          else {
            smaller_value_1 = reference_components_uint[(ulong)(uint)epsilon_int + 2];
            larger_value_1 = view_components_uint[(ulong)(uint)epsilon_int + 2];
          }
          if (1 < (int)(larger_value_1 - smaller_value_1)) {
            bVar2 = true;
          }
        }
        else {
          if (view_texel_data._4_4_ != SAMPLER_TYPE_UNSIGNED_INTEGER) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"Unrecognized sampler type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x1eac);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          if ((uint)(&local_f8)[(uint)epsilon_int] <
              (uint)view_components_float[(ulong)(uint)epsilon_int + 2]) {
            local_1b4 = view_components_float[(ulong)(uint)epsilon_int + 2];
            local_1b8 = (&local_f8)[(uint)epsilon_int];
          }
          else {
            local_1b8 = view_components_float[(ulong)(uint)epsilon_int + 2];
            local_1b4 = (&local_f8)[(uint)epsilon_int];
          }
          if (1 < (uint)((int)local_1b4 - (int)local_1b8)) {
            bVar2 = true;
          }
        }
        if (bVar2) {
          bVar1 = false;
          if (view_texel_data._4_4_ == SAMPLER_TYPE_FLOAT) {
            pTVar10 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_338,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_338,
                                 (char (*) [43])"Invalid data sampled from a texture view [");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xffffffffffffffc8);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(char (*) [33])"] created from a texture object[");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_internalformat_string);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"] at texel (");
            local_33c = mipmap_texel_data._4_4_ % this->m_texture_width;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_33c);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            local_340 = mipmap_texel_data._4_4_ / this->m_texture_height;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_340);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"): expected:(");
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(float *)(reference_components_int + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(float *)(reference_components_int + 3));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_float);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_float + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])") found:(");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(float *)(view_components_int + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(float *)(view_components_int + 3));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_float);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_float + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2c23dab);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_338);
          }
          else if (view_texel_data._4_4_ == SAMPLER_TYPE_SIGNED_INTEGER) {
            pTVar10 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_4c0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_4c0,
                                 (char (*) [58])
                                 "Invalid data sampled from a signed integer texture view [");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xffffffffffffffc8);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(char (*) [33])"] created from a texture object[");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_internalformat_string);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"] at texel (");
            local_4c4 = mipmap_texel_data._4_4_ % this->m_texture_width;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_4c4);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            local_4c8 = mipmap_texel_data._4_4_ / this->m_texture_height;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_4c8);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"): expected:(");
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(int *)(reference_components_uint + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(int *)(reference_components_uint + 3));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_int);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_int + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])") found:(");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)(view_components_uint + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)(view_components_uint + 3));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_int);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_int + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2c23dab);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_4c0);
          }
          else {
            if (view_texel_data._4_4_ != SAMPLER_TYPE_UNSIGNED_INTEGER) {
              pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar9,"Unrecognized sampler type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x1ef5);
              __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            pTVar10 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_648,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_648,
                                 (char (*) [61])
                                 "Invalid data sampled from an unsigned integer texture view [");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xffffffffffffffc8);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(char (*) [33])"] created from a texture object[");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_internalformat_string);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"] at texel (");
            local_64c = mipmap_texel_data._4_4_ % this->m_texture_width;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_64c);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            local_650 = mipmap_texel_data._4_4_ / this->m_texture_height;
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_650);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])"): expected:(");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(uint *)(view_components_float + 2));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(uint *)(view_components_float + 3));
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_uint);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,reference_components_uint + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])") found:(");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(uint *)&local_f8);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_sampler_type);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_uint);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,view_components_uint + 1);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2c23dab);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_648);
          }
          break;
        }
      }
      mipmap_texel_data._4_4_ = mipmap_texel_data._4_4_ + 1;
    }
  }
  if (bVar2) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7d0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_7d0,
                         (char (*) [49])"Invalid data read from a view of internalformat ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xffffffffffffffc8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [43])" created from a texture of internalformat ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_internalformat_string);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [23])". Byte streams follow:");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7d0);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_958);
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffff520);
    std::ios::fill((char)&local_958 + (char)*(undefined8 *)(local_958 + -0x18));
    std::ios::fill((char)&stack0xfffffffffffff520 + (char)*(undefined8 *)(lStack_ae0 + -0x18));
    std::ios_base::width((ios_base *)((long)&local_958 + *(long *)(local_958 + -0x18)),2);
    std::ios_base::width
              ((ios_base *)((long)&stack0xfffffffffffff520 + *(long *)(lStack_ae0 + -0x18)),2);
    std::operator<<(&local_948,"Mip-map data: [");
    std::operator<<(&local_ad0,"Sampled view data: [");
    for (local_ae4 = 0; local_ae4 < this->m_view_data_offset; local_ae4 = local_ae4 + 1) {
      poVar12 = std::operator<<(&local_948,"0x");
      pvVar13 = (void *)std::ostream::operator<<(poVar12,std::hex);
      std::ostream::operator<<(pvVar13,(uint)puStack_48[local_ae4]);
      poVar12 = std::operator<<(&local_ad0,"0x");
      pvVar13 = (void *)std::ostream::operator<<(poVar12,std::hex);
      std::ostream::operator<<(pvVar13,(uint)(byte)texture_internalformat_string[local_ae4]);
      if (local_ae4 == this->m_view_data_offset - 1) {
        std::operator<<(&local_948,"]");
        std::operator<<(&local_ad0,"]");
      }
      else {
        std::operator<<(&local_948,"|");
        std::operator<<(&local_ad0,"|");
      }
    }
    std::operator<<(&local_ad0,"\n");
    std::operator<<(&local_948,"\n");
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_c68,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    std::__cxx11::stringstream::str();
    pMVar11 = tcu::MessageBuilder::operator<<(&local_c68,&local_c88);
    std::__cxx11::stringstream::str();
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ca8);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_c88);
    tcu::MessageBuilder::~MessageBuilder(&local_c68);
    this->m_has_test_failed = true;
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffff520);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_958);
  }
  else {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_e28,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_e28,
                         (char (*) [49])"Correct data read from a view of internalformat ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&stack0xffffffffffffffc8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [43])" created from a texture of internalformat ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2c3fdfc);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&view_internalformat_string);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e28);
  }
  return;
}

Assistant:

void TextureViewTestViewClasses::verifyResultData(glw::GLenum texture_internalformat, glw::GLenum view_internalformat,
												  const unsigned char* texture_data_ptr,
												  const unsigned char* view_data_ptr)
{
	const char* texture_internalformat_string = TextureViewUtilities::getInternalformatString(texture_internalformat);
	const char* view_internalformat_string	= TextureViewUtilities::getInternalformatString(view_internalformat);

	/* For quite a number of cases, we can do a plain memcmp() applied to sampled texture/view data.
	 * If both buffers are a match, we're OK.
	 */
	bool				 has_failed  = false;
	const unsigned char* mipmap_data = DE_NULL;

	if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0)
	{
		/* Iterate over all texel components.
		 *
		 * The approach we're taking here works as follows:
		 *
		 * 1) Calculate what values should be sampled for each component using input mipmap
		 *    data.
		 * 2) Compare the reference values against the values returned when sampling the view.
		 *
		 * Note that in step 2) we're dealing with data that is returned by float/int/uint samplers,
		 * so we need to additionally process the data that we obtain by "casting" input data to
		 * the view's internalformat before we can perform the comparison.
		 *
		 * Finally, if the reference values are calculated for compressed data, we decompress it
		 * to GL_R8/GL_RG8/GL_RGB8/GL_RGBA8 internalformat first, depending on how many components
		 * the compressed internalformat supports.
		 **/
		bool				  can_continue = true;
		const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();

		/* Determine a few important properties first */
		const bool is_view_internalformat_compressed =
			TextureViewUtilities::isInternalformatCompressed(view_internalformat);
		unsigned int n_bits_per_view_texel = 0;

		const unsigned int n_view_components =
			TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
		_format texture_format = TextureViewUtilities::getFormatOfInternalformat(texture_internalformat);

		unsigned int view_component_sizes[4] = { 0 };
		_format		 view_format			 = TextureViewUtilities::getFormatOfInternalformat(view_internalformat);

		if (!is_view_internalformat_compressed)
		{
			TextureViewUtilities::getComponentSizeForInternalformat(view_internalformat, view_component_sizes);

			n_bits_per_view_texel =
				view_component_sizes[0] + view_component_sizes[1] + view_component_sizes[2] + view_component_sizes[3];
		}
		else
		{
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				/* Each component of decompressed data will be retrieved as a 32-bit FP */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 32 /* bits per byte */;
				}

				n_bits_per_view_texel = 32 /* bits per byte */ * n_view_components;
			}
			else
			{
				/* Each component of decompressed data is stored as either signed or unsigned
				 * byte. */
				for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
				{
					view_component_sizes[n_component] = 8 /* bits per byte */;
				}

				n_bits_per_view_texel = 8 /* bits per byte */ * n_view_components;
			}
		}

		/* If we need to use compressed data as reference, we need to ask GL to decompress
		 * the mipmap data using view-specific internalformat.
		 */
		mipmap_data = m_mipmap_data;

		if (is_view_internalformat_compressed)
		{
			/* Deallocate the buffer if necessary just in case */
			if (m_decompressed_mipmap_data != DE_NULL)
			{
				delete[] m_decompressed_mipmap_data;

				m_decompressed_mipmap_data = DE_NULL;
			}

			m_decompressed_mipmap_data =
				new unsigned char[m_texture_width * m_texture_height * (n_bits_per_view_texel >> 3)];

			glw::GLuint reference_tex_id = m_to_id;
			if (texture_internalformat == GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT ||
				texture_internalformat == GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT)
			{
				// Encodings of SIGNED and UNSIGNED BPTC compressed texture are not compatible
				// even though they are in the same view class. Since the "view" texture contains
				// the correct encoding for the results we use that as a reference instead of the
				// incompatible parent encoded.
				reference_tex_id = m_view_to_id;
			}
			gl.bindTexture(GL_TEXTURE_2D, reference_tex_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						   (n_view_components == 4) ?
							   GL_RGBA :
							   (n_view_components == 3) ? GL_RGB : (n_view_components == 2) ? GL_RG : GL_RED,
						   (texture_format == FORMAT_SNORM) ?
							   GL_BYTE :
							   (texture_format == FORMAT_FLOAT) ? GL_FLOAT : GL_UNSIGNED_BYTE,
						   m_decompressed_mipmap_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage() call failed.");

			mipmap_data = m_decompressed_mipmap_data;
		}

		for (unsigned int n_texel = 0; n_texel < m_texture_height * m_texture_width && can_continue; ++n_texel)
		{
			/* NOTE: Vertex shader stores the sampled contents of a view texture as a
			 *       vec4/ivec4/uvec4. This means that each comonent in view_data_ptr
			 *       always takes sizeof(float) = sizeof(int) = sizeof(uint) bytes.
			 *
			 * NOTE: We cast input mip-map's data to view's internalformat, which is
			 *       why we're assuming each components takes n_bits_per_view_texel
			 *       bits instead of n_bits_per_mipmap_texel.
			 */
			const unsigned char* mipmap_texel_data =
				mipmap_data + (n_bits_per_view_texel >> 3 /* 8 bits/byte */) * n_texel;
			float		  reference_components_float[4] = { 0 };
			signed int	reference_components_int[4]   = { 0 };
			unsigned int  reference_components_uint[4]  = { 0 };
			float		  view_components_float[4]		= { 0 };
			signed int	view_components_int[4]		= { 0 };
			unsigned int  view_components_uint[4]		= { 0 };
			_sampler_type view_sampler_type =
				TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
			const unsigned char* view_texel_data = view_data_ptr + sizeof(float) * n_view_components * n_texel;

			/* Retrieve data sampled from the view */
			for (unsigned int n_component = 0; n_component < n_view_components;
				 view_texel_data += sizeof(float), /* as per comment */
				 ++n_component)
			{
				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					view_components_float[n_component] = *((float*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					view_components_int[n_component] = *((signed int*)view_texel_data);

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					view_components_uint[n_component] = *((unsigned int*)view_texel_data);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized sampler type");
				}
				} /* switch (view_sampler_type) */
			}	 /* for (all components) */

			/* Compute reference data. Handle non-byte aligned internalformats manually. */
			if (view_internalformat == GL_R11F_G11F_B10F)
			{
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  red_component   = (*reference_data) & ((1 << 11) - 1);
				const unsigned int  green_component = (*reference_data >> 11) & ((1 << 11) - 1);
				const unsigned int  blue_component  = (*reference_data >> 22) & ((1 << 10) - 1);

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = Float11(red_component).asFloat();
					reference_components_float[1] = Float11(green_component).asFloat();
					reference_components_float[2] = Float10(blue_component).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB9_E5)
			{
				/* Refactored version of tcuTexture.cpp::unpackRGB999E5() */
				const unsigned int* reference_data  = (unsigned int*)mipmap_texel_data;
				const unsigned int  exponent		= (*reference_data >> 27) & ((1 << 5) - 1);
				const unsigned int  red_component   = (*reference_data) & ((1 << 9) - 1);
				const unsigned int  green_component = (*reference_data >> 9) & ((1 << 9) - 1);
				const unsigned int  blue_component  = (*reference_data >> 18) & ((1 << 9) - 1);

				float shared_exponent =
					deFloatPow(2.0f, (float)((int)exponent - 15 /* exponent bias */ - 9 /* mantissa */));

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(red_component) * shared_exponent;
					reference_components_float[1] = float(green_component) * shared_exponent;
					reference_components_float[2] = float(blue_component) * shared_exponent;
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = float(((*reference_data)) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[1] = float(((*reference_data) >> 10) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[2] = float(((*reference_data) >> 20) & (mask_rgb)) / float(mask_rgb);
					reference_components_float[3] = float(((*reference_data) >> 30) & (mask_a)) / float(mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RGB10_A2UI)
			{
				unsigned int*	  reference_data = (unsigned int*)mipmap_texel_data;
				const unsigned int mask_rgb		  = (1 << 10) - 1;
				const unsigned int mask_a		  = (1 << 2) - 1;

				if (view_sampler_type == SAMPLER_TYPE_UNSIGNED_INTEGER)
				{
					reference_components_uint[0] = ((*reference_data)) & (mask_rgb);
					reference_components_uint[1] = ((*reference_data) >> 10) & (mask_rgb);
					reference_components_uint[2] = ((*reference_data) >> 20) & (mask_rgb);
					reference_components_uint[3] = ((*reference_data) >> 30) & (mask_a);
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else if (view_internalformat == GL_RG16F)
			{
				unsigned short* reference_data = (unsigned short*)mipmap_texel_data;

				if (view_sampler_type == SAMPLER_TYPE_FLOAT)
				{
					reference_components_float[0] = tcu::Float16(*(reference_data + 0)).asFloat();
					reference_components_float[1] = tcu::Float16(*(reference_data + 1)).asFloat();
				}
				else
				{
					TCU_FAIL("Internal error: invalid sampler type requested");
				}
			}
			else
			{
				void* result_data = NULL;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
					result_data = reference_components_float;
					break;
				case SAMPLER_TYPE_SIGNED_INTEGER:
					result_data = reference_components_int;
					break;
				case SAMPLER_TYPE_UNSIGNED_INTEGER:
					result_data = reference_components_uint;
					break;

				default:
					TCU_FAIL("Unrecognized sampler type");
				}

				getComponentDataForByteAlignedInternalformat(mipmap_texel_data, n_view_components, view_component_sizes,
															 view_format, result_data);
			}

			for (unsigned int n_component = 0; n_component < n_view_components; ++n_component)
			{
				/* If view texture operates on sRGB color space, we need to adjust our
				 * reference value so that it is moved back into linear space.
				 */
				if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) &&
					!TextureViewUtilities::isInternalformatSRGB(texture_internalformat))
				{
					DE_ASSERT(view_sampler_type == SAMPLER_TYPE_FLOAT);

					/* Convert as per (8.14) from GL4.4 spec. Exclude alpha channel. */
					if (n_component != 3)
					{
						if (reference_components_float[n_component] <= 0.04045f)
						{
							reference_components_float[n_component] /= 12.92f;
						}
						else
						{
							reference_components_float[n_component] =
								deFloatPow((reference_components_float[n_component] + 0.055f) / 1.055f, 2.4f);
						}
					} /* if (n_component != 3) */
				}	 /* if (TextureViewUtilities::isInternalformatSRGB(view_internalformat) ) */

				/* Compare the reference and view texture values */
				const float		   epsilon_float = 1.0f / float((1 << (view_component_sizes[n_component] - 1)) - 1);
				const signed int   epsilon_int   = 1;
				const unsigned int epsilon_uint  = 1;

				switch (view_sampler_type)
				{
				case SAMPLER_TYPE_FLOAT:
				{
					if (de::abs(reference_components_float[n_component] - view_components_float[n_component]) >
						epsilon_float)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_SIGNED_INTEGER:
				{
					signed int larger_value  = 0;
					signed int smaller_value = 0;

					if (reference_components_int[n_component] > view_components_int[n_component])
					{
						larger_value  = reference_components_int[n_component];
						smaller_value = view_components_int[n_component];
					}
					else
					{
						smaller_value = reference_components_int[n_component];
						larger_value  = view_components_int[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_int)
					{
						has_failed = true;
					}

					break;
				}

				case SAMPLER_TYPE_UNSIGNED_INTEGER:
				{
					unsigned int larger_value  = 0;
					unsigned int smaller_value = 0;

					if (reference_components_uint[n_component] > view_components_uint[n_component])
					{
						larger_value  = reference_components_uint[n_component];
						smaller_value = view_components_uint[n_component];
					}
					else
					{
						smaller_value = reference_components_uint[n_component];
						larger_value  = view_components_uint[n_component];
					}

					if ((larger_value - smaller_value) > epsilon_uint)
					{
						has_failed = true;
					}

					break;
				}

				default:
					TCU_FAIL("Unrecognized sampler type");
				} /* switch (view_sampler_type) */

				if (has_failed)
				{
					can_continue = false;

					switch (view_sampler_type)
					{
					case SAMPLER_TYPE_FLOAT:
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data sampled from a texture view "
																	   "["
										   << view_internalformat_string << "]"
																			" created from a texture object"
																			"["
										   << texture_internalformat_string << "]"
																			   " at texel "
																			   "("
										   << (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height)
										   << "): expected:(" << reference_components_float[0] << ", "
										   << reference_components_float[1] << ", " << reference_components_float[2]
										   << ", " << reference_components_float[3] << ") found:("
										   << view_components_float[0] << ", " << view_components_float[1] << ", "
										   << view_components_float[2] << ", " << view_components_float[3] << ")."
										   << tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_SIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from a signed integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_int[0] << ", " << reference_components_int[1] << ", "
							<< reference_components_int[2] << ", " << reference_components_int[3] << ") found:("
							<< view_components_int[0] << ", " << view_components_int[1] << ", "
							<< view_components_int[2] << ", " << view_components_int[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					case SAMPLER_TYPE_UNSIGNED_INTEGER:
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid data sampled from an unsigned integer texture view "
														"["
							<< view_internalformat_string << "]"
															 " created from a texture object"
															 "["
							<< texture_internalformat_string << "]"
																" at texel "
																"("
							<< (n_texel % m_texture_width) << ", " << (n_texel / m_texture_height) << "): expected:("
							<< reference_components_uint[0] << ", " << reference_components_uint[1] << ", "
							<< reference_components_uint[2] << ", " << reference_components_uint[3] << ") found:("
							<< view_components_uint[0] << ", " << view_components_uint[1] << ", "
							<< view_components_uint[2] << ", " << view_components_uint[3] << ")."
							<< tcu::TestLog::EndMessage;

						break;
					}

					default:
						TCU_FAIL("Unrecognized sampler type");
					} /* switch (view_sampler_type) */

					break;
				} /* if (has_failed) */
			}	 /* for (all components) */
		}		  /* for (all texels) */
	}			  /* if (memcmp(texture_data_ptr, view_data_ptr, m_view_data_offset) != 0) */

	if (has_failed)
	{
		/* Log detailed information about the failure */
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]"
						   << ". Byte streams follow:" << tcu::TestLog::EndMessage;

		/* Form texture and view data strings */
		std::stringstream mipmap_data_sstream;
		std::stringstream sampled_view_data_sstream;

		mipmap_data_sstream.fill('0');
		sampled_view_data_sstream.fill('0');

		mipmap_data_sstream.width(2);
		sampled_view_data_sstream.width(2);

		mipmap_data_sstream << "Mip-map data: [";
		sampled_view_data_sstream << "Sampled view data: [";

		for (unsigned int n = 0; n < m_view_data_offset; ++n)
		{
			mipmap_data_sstream << "0x" << std::hex << (int)(mipmap_data[n]);
			sampled_view_data_sstream << "0x" << std::hex << (int)(view_data_ptr[n]);

			if (n != (m_view_data_offset - 1))
			{
				mipmap_data_sstream << "|";
				sampled_view_data_sstream << "|";
			}
			else
			{
				mipmap_data_sstream << "]";
				sampled_view_data_sstream << "]";
			}
		}

		sampled_view_data_sstream << "\n";
		mipmap_data_sstream << "\n";

		/* Log both strings */
		m_testCtx.getLog() << tcu::TestLog::Message << mipmap_data_sstream.str() << sampled_view_data_sstream.str()
						   << tcu::TestLog::EndMessage;

		/* Do not fail the test at this point. Instead, raise a failure flag that will
		 * cause the test to fail once all iterations execute */
		m_has_test_failed = true;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Correct data read from a view of internalformat "
						   << "[" << view_internalformat_string << "]"
						   << " created from a texture of internalformat "
						   << "[" << texture_internalformat_string << "]" << tcu::TestLog::EndMessage;
	}
}